

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O1

void Rml::StringUtilities::ExpandString
               (StringList *string_list,String *string,char delimiter,char quote_character,
               char unquote_character,bool ignore_repeated_delimiters)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  undefined3 in_register_00000089;
  byte *pbVar5;
  char *start_ptr;
  byte *local_50;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_48;
  undefined4 local_3c;
  byte *local_38;
  
  local_3c = CONCAT31(in_register_00000089,ignore_repeated_delimiters);
  pbVar4 = (byte *)(string->_M_dataplus)._M_p;
  local_50 = (byte *)0x0;
  bVar1 = *pbVar4;
  local_48 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)string_list;
  if (bVar1 != 0) {
    iVar3 = 0;
    pbVar5 = pbVar4;
    do {
      iVar2 = -(uint)(bVar1 == unquote_character);
      if (bVar1 == quote_character) {
        iVar2 = 1;
      }
      iVar3 = iVar2 + iVar3;
      if (iVar3 == 0 && bVar1 == delimiter) {
        if (local_50 == (byte *)0x0) {
          if ((char)local_3c == '\0') {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_48);
          }
        }
        else {
          local_38 = pbVar4 + 1;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&,char_const*>(local_48,(char **)&local_50,(char **)&local_38);
        }
        local_50 = (byte *)0x0;
      }
      else if ((((byte)(0x100002600 >> (bVar1 & 0x3f)) & bVar1 < 0x21 & iVar3 < 1) == 0) &&
              (pbVar4 = pbVar5, local_50 == (byte *)0x0)) {
        local_50 = pbVar5;
      }
      bVar1 = pbVar5[1];
      pbVar5 = pbVar5 + 1;
    } while (bVar1 != 0);
  }
  if (local_50 != (byte *)0x0) {
    local_38 = pbVar4 + 1;
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&,char_const*>(local_48,(char **)&local_50,(char **)&local_38);
  }
  return;
}

Assistant:

void StringUtilities::ExpandString(StringList& string_list, const String& string, const char delimiter, char quote_character, char unquote_character,
	bool ignore_repeated_delimiters)
{
	int quote_mode_depth = 0;
	const char* ptr = string.c_str();
	const char* start_ptr = nullptr;
	const char* end_ptr = ptr;

	while (*ptr)
	{
		// Increment the quote depth for each quote character encountered
		if (*ptr == quote_character)
		{
			++quote_mode_depth;
		}
		// And decrement it for every unquote character
		else if (*ptr == unquote_character)
		{
			--quote_mode_depth;
		}

		// If we encounter a delimiter while not in quote mode, add the item to the list
		if (*ptr == delimiter && quote_mode_depth == 0)
		{
			if (start_ptr)
				string_list.emplace_back(start_ptr, end_ptr + 1);
			else if (!ignore_repeated_delimiters)
				string_list.emplace_back();
			start_ptr = nullptr;
		}
		// Otherwise if its not white space or we're in quote mode, advance the pointers
		else if (!IsWhitespace(*ptr) || quote_mode_depth > 0)
		{
			if (!start_ptr)
				start_ptr = ptr;
			end_ptr = ptr;
		}

		ptr++;
	}

	// If there's data pending, add it.
	if (start_ptr)
		string_list.emplace_back(start_ptr, end_ptr + 1);
}